

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_new_points.cpp
# Opt level: O1

void calc_line_two_points
               (Am_Object *inter,bool first_point,int x,int y,bool *abort,int *out_x1,int *out_y1,
               int *out_x2,int *out_y2)

{
  bool bVar1;
  int iVar2;
  Am_Value *pAVar3;
  undefined7 in_register_00000031;
  double dVar4;
  double dVar5;
  int *piVar6;
  double dVar7;
  Am_Inter_Location last_points;
  int d;
  int c;
  int local_60;
  int local_5c;
  int *local_58;
  bool *local_50;
  Am_Inter_Location local_48;
  double local_40;
  int local_38;
  int local_34;
  
  local_58 = out_x1;
  pAVar3 = Am_Object::Get(inter,0xd9,0);
  iVar2 = Am_Value::operator_cast_to_int(pAVar3);
  pAVar3 = Am_Object::Get(inter,0xe1,0);
  bVar1 = Am_Value::operator_cast_to_bool(pAVar3);
  piVar6 = local_58;
  *abort = false;
  if ((int)CONCAT71(in_register_00000031,first_point) == 0) {
    local_50 = abort;
    pAVar3 = Am_Object::Get(inter,0x16a,0);
    Am_Inter_Location::Am_Inter_Location(&local_48,pAVar3);
    Am_Inter_Location::Get_Points(&local_48,&local_5c,&local_60,&local_34,&local_38);
    *piVar6 = local_5c;
    *out_y1 = local_60;
    *out_x2 = x;
    *out_y2 = y;
    if (iVar2 != 0) {
      dVar7 = (double)(x - local_5c);
      piVar6 = (int *)(double)(y - local_60);
      dVar4 = dVar7 * dVar7 + (double)piVar6 * (double)piVar6;
      if (dVar4 < 0.0) {
        local_58 = piVar6;
        local_40 = dVar7;
        dVar4 = sqrt(dVar4);
        piVar6 = local_58;
        dVar7 = local_40;
      }
      else {
        dVar4 = SQRT(dVar4);
      }
      dVar5 = (double)iVar2;
      if (dVar4 < dVar5) {
        if (bVar1) {
          *local_50 = true;
        }
        if ((dVar4 != 0.0) || (NAN(dVar4))) {
          *out_x2 = (int)((dVar7 * dVar5) / dVar4 + (double)local_5c);
          local_60 = (int)(((double)piVar6 * dVar5) / dVar4 + (double)local_60);
        }
        else {
          *out_x2 = local_5c + iVar2;
        }
        *out_y2 = local_60;
      }
    }
    Am_Inter_Location::~Am_Inter_Location(&local_48);
  }
  else {
    *local_58 = x;
    *out_y1 = y;
    *out_x2 = x + iVar2;
    *out_y2 = y;
    if (bVar1 && iVar2 != 0) {
      *abort = true;
    }
  }
  return;
}

Assistant:

void
calc_line_two_points(Am_Object &inter, bool first_point, int x, int y,
                     bool &abort, int &out_x1, int &out_y1, int &out_x2,
                     int &out_y2)
{
  int min_length = inter.Get(Am_MINIMUM_LENGTH);
  bool want_abort = inter.Get(Am_ABORT_IF_TOO_SMALL);

  abort = false;

  if (first_point) {
    out_x1 = x;
    out_y1 = y;
    out_x2 = x + min_length; //by default, line is horizontal
    out_y2 = y;
    if (want_abort && min_length) {
      Am_INTER_TRACE_PRINT(inter, "-- line too small");
      abort = true;
    }
  } else { // second point
    Am_Inter_Location last_points = inter.Get(Am_INTERIM_VALUE);
    int first_x, first_y, c, d;
    last_points.Get_Points(first_x, first_y, c, d);
    out_x1 = first_x;
    out_y1 = first_y;
    out_x2 = x; // these may be overwritten below if required by min_length
    out_y2 = y;
    if (min_length) { // time for expensive math
      double x_dist = x - first_x;
      double y_dist = y - first_y;
      double denom = sqrt((x_dist * x_dist) + (y_dist * y_dist));
      if (denom < (double)min_length) {
        if (want_abort) {
          Am_INTER_TRACE_PRINT(inter, "-- line too small");
          abort = true;
        }
        if (denom == 0.0) { // don't divide by zero
          out_x2 = first_x + min_length;
          out_y2 = first_y;
        } else { // not zero, create a min_length line in correct direction
          out_x2 = (int)(first_x + ((x_dist * min_length) / denom));
          out_y2 = (int)(first_y + ((y_dist * min_length) / denom));
        }
      }
      // else using x,y as set above is fine
    }
  }
}